

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastq_parser.hpp
# Opt level: O3

vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
* __thiscall
bioparser::FastqParser<biosoup::Sequence>::Parse
          (vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
           *__return_storage_ptr__,FastqParser<biosoup::Sequence> *this,uint64_t bytes,
          bool shorten_names)

{
  char cVar1;
  uint uVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint32_t quality_ptr;
  uint32_t comment_ptr;
  uint32_t data_ptr;
  uint64_t parsed_bytes;
  anon_class_56_7_9b2cff2a create_T;
  bool local_95;
  uint32_t local_94;
  uint32_t local_90;
  uint32_t local_8c;
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  *local_88;
  uint64_t local_80;
  ulong local_78;
  uint64_t local_70;
  anon_class_56_7_9b2cff2a local_68;
  
  local_68.shorten_names = &local_95;
  uVar9 = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.parsed_bytes = &local_70;
  local_70 = 0;
  local_68.data_ptr = &local_8c;
  local_8c = 0;
  local_68.comment_ptr = &local_90;
  local_90 = 0;
  local_68.quality_ptr = &local_94;
  local_94 = 0;
  uVar10 = (this->super_Parser<biosoup::Sequence>).buffer_bytes_;
  bVar4 = true;
  bVar6 = 0;
  bVar7 = false;
  bVar5 = false;
  local_95 = shorten_names;
  local_88 = __return_storage_ptr__;
  local_80 = bytes;
  local_68.this = this;
  local_68.dst = __return_storage_ptr__;
  do {
    uVar2 = (this->super_Parser<biosoup::Sequence>).buffer_ptr_;
    uVar8 = (ulong)uVar2;
    uVar11 = uVar8;
    if (uVar2 < uVar10) {
      do {
        local_78 = uVar9;
        cVar1 = (this->super_Parser<biosoup::Sequence>).buffer_.
                super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar8];
        if (cVar1 == '\n') {
          Parser<biosoup::Sequence>::Store
                    (&this->super_Parser<biosoup::Sequence>,
                     (ulong)((int)uVar11 - (this->super_Parser<biosoup::Sequence>).buffer_ptr_),
                     (bool)~bVar4);
          if (bVar4) {
            local_8c = (this->super_Parser<biosoup::Sequence>).storage_ptr_;
            bVar6 = 1;
            bVar4 = false;
          }
          else {
            if (bVar7) {
              local_94 = (this->super_Parser<biosoup::Sequence>).storage_ptr_;
LAB_00112cb9:
              bVar5 = true;
            }
            else {
              if (bVar5) {
                if ((this->super_Parser<biosoup::Sequence>).storage_ptr_ - local_94 <
                    local_90 - local_8c) goto LAB_00112cb9;
                Parse::anon_class_56_7_9b2cff2a::operator()(&local_68);
                if (local_80 <= local_70) {
                  return local_88;
                }
                bVar4 = true;
              }
              bVar5 = false;
            }
            bVar7 = false;
          }
        }
        else if (!(bool)(~bVar6 & 1 | cVar1 != '+')) {
          local_90 = (this->super_Parser<biosoup::Sequence>).storage_ptr_;
          bVar7 = true;
          bVar6 = 0;
        }
        uVar9 = local_78;
        uVar8 = uVar8 + 1;
        uVar10 = (int)uVar11 + 1;
        uVar11 = (ulong)uVar10;
      } while (uVar8 < (this->super_Parser<biosoup::Sequence>).buffer_bytes_);
      uVar2 = (this->super_Parser<biosoup::Sequence>).buffer_ptr_;
      if (uVar2 < uVar10) {
        Parser<biosoup::Sequence>::Store
                  (&this->super_Parser<biosoup::Sequence>,(ulong)(uVar10 - uVar2),(bool)~bVar4);
      }
    }
    if ((uVar9 & 1) != 0) {
      if ((this->super_Parser<biosoup::Sequence>).storage_ptr_ != 0) {
        Parse::anon_class_56_7_9b2cff2a::operator()(&local_68);
      }
      return local_88;
    }
    (this->super_Parser<biosoup::Sequence>).buffer_ptr_ = 0;
    pcVar3 = (this->super_Parser<biosoup::Sequence>).buffer_.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar10 = gzread((this->super_Parser<biosoup::Sequence>).file_._M_t.
                    super___uniq_ptr_impl<gzFile_s,_int_(*)(gzFile_s_*)>._M_t.
                    super__Tuple_impl<0UL,_gzFile_s_*,_int_(*)(gzFile_s_*)>.
                    super__Head_base<0UL,_gzFile_s_*,_false>._M_head_impl,pcVar3,
                    *(int *)&(this->super_Parser<biosoup::Sequence>).buffer_.
                             super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish - (int)pcVar3);
    (this->super_Parser<biosoup::Sequence>).buffer_bytes_ = uVar10;
    uVar9 = CONCAT71((int7)(uVar9 >> 8),
                     (ulong)uVar10 <
                     (ulong)((long)(this->super_Parser<biosoup::Sequence>).buffer_.
                                   super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(this->super_Parser<biosoup::Sequence>).buffer_.
                                  super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start));
  } while( true );
}

Assistant:

std::vector<std::unique_ptr<T>> Parse(
      std::uint64_t bytes, bool shorten_names = true) override {
    std::vector<std::unique_ptr<T>> dst;
    std::uint64_t parsed_bytes = 0;
    std::uint32_t data_ptr = 0;
    std::uint32_t comment_ptr = 0;
    std::uint32_t quality_ptr = 0;

    auto create_T = [&] () -> void {
      if (data_ptr == 0 || comment_ptr == 0 || quality_ptr == 0) {
        throw std::invalid_argument(
            "[bioparser::FastqParser] error: invalid file format");
      }

      auto name_len = shorten_names ?
          this->Shorten(this->storage().data(), data_ptr) :
          this->RightStrip(this->storage().data(), data_ptr);

      auto data_len = comment_ptr - data_ptr;

      auto quality_len = this->storage_ptr() - quality_ptr;

      if (name_len == 0 || this->storage()[0] != '@' || data_len == 0 ||
          quality_len == 0 || data_len != quality_len) {
        throw std::invalid_argument(
            "[bioparser::FastqParser] error: invalid file format");
      }

      dst.emplace_back(std::unique_ptr<T>(new T(
          static_cast<const char*>(this->storage().data() + 1), name_len - 1,
          static_cast<const char*>(this->storage().data() + data_ptr), data_len,
          static_cast<const char*>(this->storage().data() + quality_ptr), quality_len)));  // NOLINT

      parsed_bytes += this->storage_ptr();
      data_ptr = 0;
      comment_ptr = 0;
      quality_ptr = 0;
      this->Clear();
    };

    bool is_eof = false;
    bool is_name = true;
    bool is_data = false;
    bool is_comment = false;
    bool is_quality = false;

    while (true) {
      auto buffer_ptr = this->buffer_ptr();
      for (; buffer_ptr < this->buffer_bytes(); ++buffer_ptr) {
        auto c = this->buffer()[buffer_ptr];
        if (c == '\n') {
          this->Store(buffer_ptr - this->buffer_ptr(), !is_name);
          if (is_name) {
            is_name = false;
            is_data = true;
            data_ptr = this->storage_ptr();
          } else if (is_comment) {
            is_comment = false;
            is_quality = true;
            quality_ptr = this->storage_ptr();
          } else if (is_quality &&
                this->storage_ptr() - quality_ptr >= comment_ptr - data_ptr) {
            is_quality = false;
            is_name = true;
            create_T();
            if (parsed_bytes >= bytes) {
              return dst;
            }
          }
        } else if (is_data && c == '+') {
          is_data = false;
          is_comment = true;
          comment_ptr = this->storage_ptr();
        }
      }
      if (this->buffer_ptr() < buffer_ptr) {
        this->Store(buffer_ptr - this->buffer_ptr(), !is_name);
      }

      if (is_eof) {
        break;
      }
      is_eof = this->Read();
    }

    if (this->storage_ptr() != 0) {
      create_T();
    }

    return dst;
  }